

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuillotineBinPack.cpp
# Opt level: O0

void __thiscall GuillotineBinPack::Init(GuillotineBinPack *this,int width,int height)

{
  undefined1 local_28 [8];
  Rect n;
  int height_local;
  int width_local;
  GuillotineBinPack *this_local;
  
  this->binWidth = width;
  this->binHeight = height;
  n.width = height;
  n.height = width;
  DisjointRectCollection::Clear(&this->disjointRects);
  TArray<Rect,_Rect>::Clear(&this->usedRectangles);
  local_28._0_4_ = 0;
  local_28._4_4_ = 0;
  n.x = n.height;
  n.y = n.width;
  TArray<Rect,_Rect>::Clear(&this->freeRectangles);
  TArray<Rect,_Rect>::Push(&this->freeRectangles,(Rect *)local_28);
  return;
}

Assistant:

void GuillotineBinPack::Init(int width, int height)
{
	binWidth = width;
	binHeight = height;

#ifdef _DEBUG
	disjointRects.Clear();
#endif

	// Clear any memory of previously packed rectangles.
	usedRectangles.Clear();

	// We start with a single big free rectangle that spans the whole bin.
	Rect n;
	n.x = 0;
	n.y = 0;
	n.width = width;
	n.height = height;

	freeRectangles.Clear();
	freeRectangles.Push(n);
}